

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_graphsensing.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  typed_value<unsigned_int,_char> *ptVar5;
  typed_value<pgi::PolicyInitialization,_char> *ptVar6;
  typed_value<unsigned_long,_char> *ptVar7;
  typed_value<int,_char> *ptVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  typed_value<bool,_char> *ptVar10;
  typed_value<double,_char> *ptVar11;
  basic_command_line_parser<char> *rng_00;
  RewardModel *r_00;
  void *pvVar12;
  size_t sVar13;
  uint *puVar14;
  runtime_error *this;
  bool *pbVar15;
  ParticleSet<pgi::GraphSensing::state_t> *pPVar16;
  JointPolicy *jp_00;
  StateTransitionModel *t_00;
  RSSObservationModel *o_00;
  ostream *poVar17;
  reference puVar18;
  size_type sVar19;
  undefined8 *in_RSI;
  ForwardPassParticle<pgi::GraphSensing::state_t> *this_00;
  ParticleSet<pgi::GraphSensing::state_t> *p;
  unsigned_long *qq;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ql;
  unsigned_long *q;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint s;
  ForwardPassParticle<pgi::GraphSensing::state_t> fwd;
  ofstream fs_4;
  size_t agent_3;
  ostringstream ss;
  ofstream fs_2;
  ofstream fs_3;
  size_t agent_2;
  double improved_policy_value;
  rep duration;
  time_point t3;
  ImprovementResult bp;
  time_point t1;
  int i;
  BackPassProperties props;
  ofstream fs;
  ofstream fs_1;
  size_t agent_1;
  double best_value;
  ofstream ftime;
  ofstream fvalue;
  ParticleSet<pgi::GraphSensing::state_t> init_particles;
  JointPolicy jp;
  size_t agent;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_policy_graphs;
  RSSObservationModel o;
  JointObservationSpace jos;
  RewardModel r;
  StateTransitionModel t;
  JointActionSpace jas;
  PRNG rng;
  variables_map vm;
  options_description cmdline_options;
  options_description config;
  double sy;
  double sx;
  double my;
  double mx;
  PolicyInitialization policy_initialization;
  size_t blind_policy_initial_joint_action;
  int num_particle_rollout;
  int num_rollouts;
  int num_particles_fwd;
  int improvement_steps;
  uint width;
  uint horizon;
  uint rng_seed;
  string *in_stack_ffffffffffffd358;
  JointPolicy *name;
  duration<long,_std::ratio<1L,_1000000000L>_> *__d;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  JointPolicy *in_stack_ffffffffffffd360;
  JointPolicy *this_02;
  JointPolicy *pJVar20;
  JointDiscreteSpace<pgi::DiscreteAction> *in_stack_ffffffffffffd368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Base_ptr *__lhs_00;
  JointDiscreteSpace<pgi::DiscreteAction> *in_stack_ffffffffffffd370;
  PRNG *rng_01;
  PRNG *in_stack_ffffffffffffd378;
  JointPolicy *in_stack_ffffffffffffd380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd388;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *in_stack_ffffffffffffd390;
  PolicyGraph *in_stack_ffffffffffffd398;
  ostream *in_stack_ffffffffffffd3a0;
  JointPolicy *in_stack_ffffffffffffd3a8;
  undefined4 in_stack_ffffffffffffd3b0;
  uint uVar21;
  undefined4 in_stack_ffffffffffffd3b4;
  DiscreteSpace<pgi::DiscreteObservation> *in_stack_ffffffffffffd3b8;
  JointPolicy *in_stack_ffffffffffffd3c0;
  undefined8 in_stack_ffffffffffffd3c8;
  int argc_00;
  basic_command_line_parser<char> *in_stack_ffffffffffffd3d0;
  basic_command_line_parser<char> *pbVar22;
  basic_command_line_parser<char> *in_stack_ffffffffffffd3d8;
  ostream *in_stack_ffffffffffffd3e0;
  JointPolicy *in_stack_ffffffffffffd3e8;
  undefined7 in_stack_ffffffffffffd3f0;
  _Setfill<char> in_stack_ffffffffffffd3f7;
  ostream *in_stack_ffffffffffffd3f8;
  _Setw in_stack_ffffffffffffd404;
  RSSObservationModel *in_stack_ffffffffffffd410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd418;
  JointActionSpace *in_stack_ffffffffffffd420;
  JointObservationSpace *in_stack_ffffffffffffd428;
  ostream *in_stack_ffffffffffffd430;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  *in_stack_ffffffffffffd4e8;
  JointPolicy *in_stack_ffffffffffffd4f0;
  size_t in_stack_ffffffffffffd540;
  size_t in_stack_ffffffffffffd548;
  undefined4 in_stack_ffffffffffffd550;
  undefined4 in_stack_ffffffffffffd554;
  undefined8 in_stack_ffffffffffffd558;
  RSSObservationModel *jas_00;
  JointObservationSpace *jos_00;
  PRNG *rng_02;
  StateTransitionModel *in_stack_ffffffffffffd6d0;
  JointPolicy *in_stack_ffffffffffffd6d8;
  undefined4 in_stack_ffffffffffffd6e0;
  uint in_stack_ffffffffffffd6e4;
  ulong in_stack_ffffffffffffd6e8;
  RSSObservationModel *in_stack_ffffffffffffd720;
  JointActionSpace *jas_01;
  JointObservationSpace *jos_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2718;
  undefined1 *local_2710;
  undefined1 local_2708 [24];
  reference local_26f0;
  unsigned_long *local_26e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_26e0;
  undefined1 local_26d8 [24];
  undefined1 *local_26c0;
  uint local_26b4;
  string local_2608 [32];
  string local_25e8 [32];
  string local_25c8 [32];
  string local_25a8 [32];
  string local_2588 [32];
  undefined1 local_2568 [512];
  basic_command_line_parser<char> *local_2368;
  char local_2359;
  int local_2358;
  undefined1 local_2351 [33];
  ostringstream local_2330 [383];
  allocator local_21b1;
  string local_21b0 [32];
  string local_2190 [32];
  undefined1 local_2170 [560];
  string local_1f40 [39];
  allocator local_1f19;
  string local_1f18 [32];
  string local_1ef8 [32];
  string local_1ed8 [32];
  string local_1eb8 [32];
  undefined1 local_1e98 [512];
  ulong local_1c98;
  ForwardPassParticle<pgi::GraphSensing::state_t> *local_1c90;
  rep local_1c88;
  duration<long,_std::ratio<1L,_1000000L>_> local_1c80;
  rep local_1c78;
  undefined8 local_1c70;
  undefined8 local_1b50;
  double local_1b40;
  joint_vertex_t local_1b18;
  undefined8 local_1af8;
  undefined8 local_1af0;
  allocator local_1ae1;
  string local_1ae0 [36];
  int local_1abc;
  undefined1 local_1ab8 [32];
  string local_1a98 [32];
  string local_1a78 [32];
  undefined1 local_1a58 [560];
  string local_1828 [39];
  allocator local_1801;
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  undefined1 local_1780 [512];
  RSSObservationModel *local_1580;
  ForwardPassParticle<pgi::GraphSensing::state_t> *local_1578;
  allocator local_1569;
  string local_1568 [32];
  string local_1548 [32];
  undefined1 local_1528 [519];
  allocator local_1321;
  string local_1320 [32];
  string local_1300 [32];
  undefined1 local_12e0 [520];
  double local_10d8;
  joint_vertex_t local_10b0;
  undefined8 local_1090;
  undefined8 local_1088;
  allocator local_1079;
  string local_1078 [32];
  undefined1 local_1058 [215];
  allocator local_f81;
  string local_f80 [88];
  ulong local_f28;
  undefined1 local_f08 [200];
  JointPolicy local_e40;
  JointPolicy local_d88 [18];
  undefined4 local_3c0;
  undefined1 local_3b9 [153];
  basic_parsed_options local_320 [40];
  variables_map local_2f8 [16];
  JointActionSpace local_2e8;
  options_description local_258 [128];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [36];
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined8 local_160 [3];
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  options_description local_e0 [144];
  undefined8 local_50;
  undefined8 local_48;
  int local_3c;
  int local_24;
  int local_20;
  uint local_1c;
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffd3c8 >> 0x20);
  local_4 = 0;
  pcVar4 = (char *)*in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,pcVar4,&local_141);
  std::operator+((char *)in_stack_ffffffffffffd368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd360);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd368,(char *)in_stack_ffffffffffffd360);
  boost::program_options::options_description::options_description
            (local_e0,local_100,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  local_160[0] = boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_160,"help");
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffd370);
  local_164 = 3;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffd390,
                      (uint *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"horizon,h",(char *)ptVar5);
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffd370);
  local_168 = 3;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffd390,
                      (uint *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"policy-width,w",(char *)ptVar5);
  boost::program_options::value<pgi::PolicyInitialization>
            ((PolicyInitialization *)in_stack_ffffffffffffd370);
  local_16c = 0;
  ptVar6 = boost::program_options::typed_value<pgi::PolicyInitialization,_char>::default_value
                     ((typed_value<pgi::PolicyInitialization,_char> *)in_stack_ffffffffffffd390,
                      (PolicyInitialization *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"policy-initialization,p",(char *)ptVar6);
  boost::program_options::value<unsigned_long>((unsigned_long *)in_stack_ffffffffffffd370);
  local_178 = 0;
  ptVar7 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     ((typed_value<unsigned_long,_char> *)in_stack_ffffffffffffd390,
                      (unsigned_long *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"blind-action,b",(char *)ptVar7);
  boost::program_options::value<int>((int *)in_stack_ffffffffffffd370);
  local_17c = 9;
  ptVar8 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffd390,
                      (int *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"improvement-steps,i",(char *)ptVar8);
  boost::program_options::value<int>((int *)in_stack_ffffffffffffd370);
  local_180 = 100;
  ptVar8 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffd390,
                      (int *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"num-rollouts,r",(char *)ptVar8);
  boost::program_options::value<int>((int *)in_stack_ffffffffffffd370);
  local_184 = 100;
  ptVar8 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffd390,
                      (int *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"num-particles-rollout,k",(char *)ptVar8);
  boost::program_options::value<int>((int *)in_stack_ffffffffffffd370);
  local_188 = 1000;
  ptVar8 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffd390,
                      (int *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"num-particles,n",(char *)ptVar8);
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffd370);
  local_18c = 0x499602d2;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffd390,
                      (uint *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"seed,s",(char *)ptVar5);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"./",&local_1b1);
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_ffffffffffffd390,in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"output-prefix,o",(char *)ptVar9);
  boost::program_options::bool_switch();
  local_1b2 = 0;
  ptVar10 = boost::program_options::typed_value<bool,_char>::default_value
                      ((typed_value<bool,_char> *)in_stack_ffffffffffffd390,
                       (bool *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"gaussian",(char *)ptVar10);
  boost::program_options::value<double>((double *)in_stack_ffffffffffffd370);
  local_1c0 = 0x3fb999999999999a;
  ptVar11 = boost::program_options::typed_value<double,_char>::default_value
                      ((typed_value<double,_char> *)in_stack_ffffffffffffd390,
                       (double *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"mx",(char *)ptVar11);
  boost::program_options::value<double>((double *)in_stack_ffffffffffffd370);
  local_1c8 = 0x3fb999999999999a;
  ptVar11 = boost::program_options::typed_value<double,_char>::default_value
                      ((typed_value<double,_char> *)in_stack_ffffffffffffd390,
                       (double *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"my",(char *)ptVar11);
  boost::program_options::value<double>((double *)in_stack_ffffffffffffd370);
  local_1d0 = 0x3fb999999999999a;
  ptVar11 = boost::program_options::typed_value<double,_char>::default_value
                      ((typed_value<double,_char> *)in_stack_ffffffffffffd390,
                       (double *)in_stack_ffffffffffffd388);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"sx",(char *)ptVar11);
  boost::program_options::value<double>((double *)in_stack_ffffffffffffd370);
  local_1d8 = 0x3fb999999999999a;
  ptVar11 = boost::program_options::typed_value<double,_char>::default_value
                      ((typed_value<double,_char> *)in_stack_ffffffffffffd390,
                       (double *)in_stack_ffffffffffffd388);
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)"sy",(char *)ptVar11);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  boost::program_options::options_description::options_description
            (local_258,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  boost::program_options::options_description::add(local_258);
  boost::program_options::variables_map::variables_map(local_2f8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (in_stack_ffffffffffffd3d0,argc_00,(char **)in_stack_ffffffffffffd3c0);
  rng_00 = boost::program_options::basic_command_line_parser<char>::options
                     ((basic_command_line_parser<char> *)in_stack_ffffffffffffd360,
                      (options_description *)in_stack_ffffffffffffd358);
  boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffd3d8);
  boost::program_options::store(local_320,local_2f8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x2c1e1a);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x2c1e27);
  boost::program_options::notify(local_2f8);
  jas_01 = &local_2e8;
  jos_01 = (JointObservationSpace *)local_3b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3b9 + 1),"help",(allocator *)jos_01);
  r_00 = (RewardModel *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
         ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)in_stack_ffffffffffffd370,(key_type *)in_stack_ffffffffffffd368);
  std::__cxx11::string::~string((string *)(local_3b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3b9);
  if (r_00 == (RewardModel *)0x0) {
    pgi::PRNG::PRNG((PRNG *)in_stack_ffffffffffffd360,
                    (uint)((ulong)in_stack_ffffffffffffd358 >> 0x20));
    pgi::JointDiscreteSpace<pgi::DiscreteAction>::JointDiscreteSpace
              (in_stack_ffffffffffffd370,in_stack_ffffffffffffd368);
    pgi::GraphSensing::StateTransitionModel::StateTransitionModel((StateTransitionModel *)0x2c2101);
    pgi::GraphSensing::RewardModel::RewardModel((RewardModel *)0x2c2110);
    pgi::JointDiscreteSpace<pgi::DiscreteObservation>::JointDiscreteSpace
              ((JointDiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd370,
               (JointDiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd368);
    pgi::GraphSensing::RSSObservationModel::RSSObservationModel
              ((RSSObservationModel *)in_stack_ffffffffffffd360);
    std::
    vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ::vector((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
              *)0x2c2144);
    for (local_f28 = 0; uVar1 = local_f28,
        sVar13 = pgi::JointDiscreteSpace<pgi::DiscreteAction>::num_local_spaces
                           ((JointDiscreteSpace<pgi::DiscreteAction> *)0x2c216d), uVar1 < sVar13;
        local_f28 = local_f28 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f80,"horizon",&local_f81);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
      puVar14 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x2c21ef)
      ;
      in_stack_ffffffffffffd6e4 = *puVar14;
      in_stack_ffffffffffffd6e8 = (ulong)local_1c;
      pgi::IndexSpace<unsigned_long>::num_local_indices
                ((IndexSpace<unsigned_long> *)in_stack_ffffffffffffd360,
                 (unsigned_long)in_stack_ffffffffffffd358);
      in_stack_ffffffffffffd6d8 =
           (JointPolicy *)
           pgi::IndexSpace<unsigned_long>::num_local_indices
                     ((IndexSpace<unsigned_long> *)in_stack_ffffffffffffd360,
                      (unsigned_long)in_stack_ffffffffffffd358);
      pgi::fixed_width((uint)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                       CONCAT44(in_stack_ffffffffffffd554,in_stack_ffffffffffffd550),
                       in_stack_ffffffffffffd548,in_stack_ffffffffffffd540);
      std::
      vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
      ::
      emplace_back<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>
                ((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                  *)in_stack_ffffffffffffd370,
                 (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
                  *)in_stack_ffffffffffffd368);
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
      ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
                         *)in_stack_ffffffffffffd360);
      std::__cxx11::string::~string(local_f80);
      std::allocator<char>::~allocator((allocator<char> *)&local_f81);
    }
    if (local_3c == 0) {
      pgi::set_random((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                       *)in_stack_ffffffffffffd380,in_stack_ffffffffffffd378);
    }
    else {
      if (local_3c == 1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,
                   "Greedy open loop initialization not implemented for continuous-state problems!")
        ;
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_3c == 2) {
        pgi::set_random((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                         *)in_stack_ffffffffffffd380,in_stack_ffffffffffffd378);
        pgi::set_blind((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                        *)in_stack_ffffffffffffd3c0,(size_t)in_stack_ffffffffffffd3b8,
                       (JointActionSpace *)
                       CONCAT44(in_stack_ffffffffffffd3b4,in_stack_ffffffffffffd3b0));
      }
    }
    pgi::JointPolicy::JointPolicy(in_stack_ffffffffffffd4f0,in_stack_ffffffffffffd4e8);
    pgi::ParticleSet<pgi::GraphSensing::state_t>::ParticleSet
              ((ParticleSet<pgi::GraphSensing::state_t> *)in_stack_ffffffffffffd360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1078,"gaussian",&local_1079);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
    pbVar15 = boost::program_options::variable_value::as<bool>((variable_value *)0x2c252a);
    bVar2 = *pbVar15;
    std::__cxx11::string::~string(local_1078);
    std::allocator<char>::~allocator((allocator<char> *)&local_1079);
    if ((bVar2 & 1U) == 0) {
      pgi::GraphSensing::sample_initial_states
                ((vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_> *)
                 in_stack_ffffffffffffd380,(int)((ulong)in_stack_ffffffffffffd378 >> 0x20),
                 (PRNG *)in_stack_ffffffffffffd370);
    }
    else {
      local_1090 = local_48;
      local_1088 = local_50;
      pgi::GraphSensing::sample_initial_states_gaussian
                ((vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_> *)
                 in_stack_ffffffffffffd3c0,(int)((ulong)in_stack_ffffffffffffd3b8 >> 0x20),
                 (location_t *)CONCAT44(in_stack_ffffffffffffd3b4,in_stack_ffffffffffffd3b0),
                 (double)in_stack_ffffffffffffd3a8,(double)in_stack_ffffffffffffd3a0,
                 (PRNG *)in_stack_ffffffffffffd398);
    }
    local_10b0 = pgi::JointPolicy::root(in_stack_ffffffffffffd3c0);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2c269d);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd380,
               (size_type)in_stack_ffffffffffffd378,
               (value_type_conflict1 *)in_stack_ffffffffffffd370,
               (allocator_type *)in_stack_ffffffffffffd368);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd370,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd368);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd370);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2c26fb);
    local_10d8 = 1.0 / (double)local_24;
    std::allocator<double>::allocator((allocator<double> *)0x2c2739);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd380,
               (size_type)in_stack_ffffffffffffd378,
               (value_type_conflict2 *)in_stack_ffffffffffffd370,
               (allocator_type *)in_stack_ffffffffffffd368);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd370,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd368);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd370);
    std::allocator<double>::~allocator((allocator<double> *)0x2c2797);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1320,"output-prefix",&local_1321);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x2c27f6);
    std::operator+(in_stack_ffffffffffffd388,(char *)in_stack_ffffffffffffd380);
    std::ofstream::ofstream(local_12e0,local_1300,_S_out);
    std::__cxx11::string::~string(local_1300);
    std::__cxx11::string::~string(local_1320);
    std::allocator<char>::~allocator((allocator<char> *)&local_1321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1568,"output-prefix",&local_1569);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x2c28c0);
    std::operator+(in_stack_ffffffffffffd388,(char *)in_stack_ffffffffffffd380);
    std::ofstream::ofstream(local_1528,local_1548,_S_out);
    std::__cxx11::string::~string(local_1548);
    std::__cxx11::string::~string(local_1568);
    std::allocator<char>::~allocator((allocator<char> *)&local_1569);
    jos_00 = (JointObservationSpace *)local_1058;
    rng_02 = (PRNG *)(local_1058 + 0x30);
    pgi::JointPolicy::root(in_stack_ffffffffffffd3c0);
    pJVar20 = local_d88;
    rng_01 = (PRNG *)(local_f08 + 0x70);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&local_e40.stepmap._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
    this_02 = &local_e40;
    name = (JointPolicy *)local_f08;
    this_00 = (ForwardPassParticle<pgi::GraphSensing::state_t> *)
              pgi::
              estimate_value<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                        (in_stack_ffffffffffffd404._M_n,
                         (vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                          *)in_stack_ffffffffffffd3f8,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffd3f7._M_c,in_stack_ffffffffffffd3f0),
                         in_stack_ffffffffffffd3e8,(joint_vertex_t)in_stack_ffffffffffffd3e0,
                         (StateTransitionModel *)in_stack_ffffffffffffd3d8,in_stack_ffffffffffffd410
                         ,(RewardModel *)in_stack_ffffffffffffd418,in_stack_ffffffffffffd420,
                         in_stack_ffffffffffffd428,(PRNG *)in_stack_ffffffffffffd430);
    local_1578 = this_00;
    pPVar16 = (ParticleSet<pgi::GraphSensing::state_t> *)
              std::ostream::operator<<(local_12e0,(double)this_00);
    std::ostream::operator<<(pPVar16,std::endl<char,std::char_traits<char>>);
    jp_00 = (JointPolicy *)std::operator<<((ostream *)&std::cout,"Policy value: ");
    t_00 = (StateTransitionModel *)std::ostream::operator<<(jp_00,(double)local_1578);
    std::ostream::operator<<(t_00,std::endl<char,std::char_traits<char>>);
    local_1580 = (RSSObservationModel *)0x0;
    while (jas_00 = local_1580,
          o_00 = (RSSObservationModel *)
                 pgi::JointDiscreteSpace<pgi::DiscreteAction>::num_local_spaces
                           ((JointDiscreteSpace<pgi::DiscreteAction> *)0x2c2ab1), jas_00 < o_00) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1800,"output-prefix",&local_1801);
      boost::program_options::variables_map::operator[]((variables_map *)this_02,(string *)name);
      boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x2c2b33);
      std::operator+(in_stack_ffffffffffffd388,(char *)in_stack_ffffffffffffd380);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffd398);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd390);
      std::operator+(__lhs,(char *)this_02);
      std::ofstream::ofstream(local_1780,local_17a0,_S_out);
      std::__cxx11::string::~string(local_17a0);
      std::__cxx11::string::~string(local_17c0);
      std::__cxx11::string::~string(local_1828);
      std::__cxx11::string::~string(local_17e0);
      std::__cxx11::string::~string(local_1800);
      std::allocator<char>::~allocator((allocator<char> *)&local_1801);
      pgi::JointPolicy::local_policy(this_02,(size_t)name);
      pgi::JointDiscreteSpace<pgi::DiscreteAction>::get
                ((JointDiscreteSpace<pgi::DiscreteAction> *)this_02,(size_t)name);
      pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                ((DiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd398);
      pgi::JointDiscreteSpace<pgi::DiscreteObservation>::get
                ((JointDiscreteSpace<pgi::DiscreteObservation> *)this_02,(size_t)name);
      pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                ((DiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd398);
      pgi::print(in_stack_ffffffffffffd3a0,in_stack_ffffffffffffd398,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd390,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)rng_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)rng_01);
      std::ofstream::~ofstream(local_1780);
      local_1580 = (RSSObservationModel *)
                   ((long)&((IndexSpace<unsigned_long> *)&local_1580->index_to_xy_loc_)->
                           _vptr_IndexSpace + 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a98,"output-prefix",(allocator *)(local_1ab8 + 0x1f));
    boost::program_options::variables_map::operator[]((variables_map *)this_02,(string *)name);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x2c2fee);
    std::operator+(in_stack_ffffffffffffd388,(char *)in_stack_ffffffffffffd380);
    std::ofstream::ofstream(local_1a58,local_1a78,_S_out);
    std::__cxx11::string::~string(local_1a78);
    std::__cxx11::string::~string(local_1a98);
    std::allocator<char>::~allocator((allocator<char> *)(local_1ab8 + 0x1f));
    pvVar12 = (void *)std::ostream::operator<<(local_1a58,(double)local_1578);
    std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
    pgi::backpass::BackPassProperties::BackPassProperties((BackPassProperties *)local_1ab8);
    local_1ab8._8_8_ =
         (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          *)0x3fa999999999999a;
    for (local_1abc = 1; local_1abc <= local_20; local_1abc = local_1abc + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1ae0,"gaussian",&local_1ae1);
      boost::program_options::variables_map::operator[]((variables_map *)this_02,(string *)name);
      pbVar15 = boost::program_options::variable_value::as<bool>((variable_value *)0x2c312b);
      bVar2 = *pbVar15;
      std::__cxx11::string::~string(local_1ae0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
      if ((bVar2 & 1U) == 0) {
        pgi::GraphSensing::sample_initial_states
                  ((vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                    *)in_stack_ffffffffffffd380,(int)((ulong)pJVar20 >> 0x20),rng_01);
      }
      else {
        local_1af8 = local_48;
        local_1af0 = local_50;
        pgi::GraphSensing::sample_initial_states_gaussian
                  ((vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                    *)in_stack_ffffffffffffd3c0,(int)((ulong)in_stack_ffffffffffffd3b8 >> 0x20),
                   (location_t *)CONCAT44(in_stack_ffffffffffffd3b4,in_stack_ffffffffffffd3b0),
                   (double)in_stack_ffffffffffffd3a8,(double)in_stack_ffffffffffffd3a0,
                   (PRNG *)in_stack_ffffffffffffd398);
      }
      local_1b18 = pgi::JointPolicy::root(in_stack_ffffffffffffd3c0);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2c330a);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffd380,
                 (size_type)pJVar20,(value_type_conflict1 *)rng_01,(allocator_type *)__lhs);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)rng_01,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__lhs);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)rng_01);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2c3368);
      local_1b40 = 1.0 / (double)local_24;
      std::allocator<double>::allocator((allocator<double> *)0x2c33a6);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd380,
                 (size_type)pJVar20,(value_type_conflict2 *)rng_01,(allocator_type *)__lhs);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)rng_01,
                 (vector<double,_std::allocator<double>_> *)__lhs);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)rng_01);
      std::allocator<double>::~allocator((allocator<double> *)0x2c3404);
      local_1b50 = std::chrono::_V2::system_clock::now();
      pgi::JointPolicy::JointPolicy(in_stack_ffffffffffffd380,pJVar20);
      in_stack_ffffffffffffd380 = (JointPolicy *)local_1ab8;
      __lhs_00 = (_Base_ptr *)
                 ((long)&local_e40.stepmap._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
      pJVar20 = &local_e40;
      __d = (duration<long,_std::ratio<1L,_1000000000L>_> *)local_f08;
      pgi::backpass::
      improve_particle<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                ((int)(in_stack_ffffffffffffd6e8 >> 0x20),(int)in_stack_ffffffffffffd6e8,
                 (ParticleSet<pgi::GraphSensing::state_t> *)
                 CONCAT44(in_stack_ffffffffffffd6e4,in_stack_ffffffffffffd6e0),
                 in_stack_ffffffffffffd6d8,in_stack_ffffffffffffd6d0,in_stack_ffffffffffffd720,r_00,
                 jas_01,jos_01,(PRNG *)rng_00,(BackPassProperties *)ptVar11);
      pgi::JointPolicy::~JointPolicy(pJVar20);
      local_1c70 = std::chrono::_V2::system_clock::now();
      local_1c88 = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)__lhs_00,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)pJVar20);
      local_1c80.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (__d);
      local_1c78 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1c80);
      pvVar12 = (void *)std::ostream::operator<<(local_1528,local_1c78);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
      pgi::JointPolicy::root(in_stack_ffffffffffffd3c0);
      pJVar20 = local_d88;
      rng_01 = (PRNG *)(local_f08 + 0x70);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&local_e40.stepmap._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
      this_02 = &local_e40;
      name = (JointPolicy *)local_f08;
      local_1c90 = (ForwardPassParticle<pgi::GraphSensing::state_t> *)
                   pgi::
                   estimate_value<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                             (in_stack_ffffffffffffd404._M_n,
                              (vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                               *)in_stack_ffffffffffffd3f8,
                              (vector<double,_std::allocator<double>_> *)
                              CONCAT17(in_stack_ffffffffffffd3f7._M_c,in_stack_ffffffffffffd3f0),
                              in_stack_ffffffffffffd3e8,(joint_vertex_t)in_stack_ffffffffffffd3e0,
                              (StateTransitionModel *)in_stack_ffffffffffffd3d8,
                              in_stack_ffffffffffffd410,(RewardModel *)in_stack_ffffffffffffd418,
                              in_stack_ffffffffffffd420,in_stack_ffffffffffffd428,
                              (PRNG *)in_stack_ffffffffffffd430);
      pvVar12 = (void *)std::ostream::operator<<(local_12e0,(double)local_1c90);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
      if ((double)local_1578 < (double)local_1c90) {
        local_1578 = local_1c90;
        pgi::JointPolicy::operator=(this_02,name);
        for (local_1c98 = 0; uVar1 = local_1c98,
            sVar13 = pgi::JointDiscreteSpace<pgi::DiscreteAction>::num_local_spaces
                               ((JointDiscreteSpace<pgi::DiscreteAction> *)0x2c370b), uVar1 < sVar13
            ; local_1c98 = local_1c98 + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f18,"output-prefix",&local_1f19);
          boost::program_options::variables_map::operator[]((variables_map *)this_02,(string *)name)
          ;
          boost::program_options::variable_value::as<std::__cxx11::string>
                    ((variable_value *)0x2c378d);
          std::operator+(in_stack_ffffffffffffd388,(char *)in_stack_ffffffffffffd380);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffd398);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffd398,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffd390);
          std::operator+(__lhs,(char *)this_02);
          std::ofstream::ofstream(local_1e98,local_1eb8,_S_out);
          std::__cxx11::string::~string(local_1eb8);
          std::__cxx11::string::~string(local_1ed8);
          std::__cxx11::string::~string(local_1f40);
          std::__cxx11::string::~string(local_1ef8);
          std::__cxx11::string::~string(local_1f18);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f19);
          pgi::JointPolicy::local_policy(this_02,(size_t)name);
          pgi::JointDiscreteSpace<pgi::DiscreteAction>::get
                    ((JointDiscreteSpace<pgi::DiscreteAction> *)this_02,(size_t)name);
          pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                    ((DiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd398);
          pgi::JointDiscreteSpace<pgi::DiscreteObservation>::get
                    ((JointDiscreteSpace<pgi::DiscreteObservation> *)this_02,(size_t)name);
          pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                    ((DiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd398);
          pgi::print(in_stack_ffffffffffffd3a0,in_stack_ffffffffffffd398,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd390,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd388);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)rng_01);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)rng_01);
          std::ofstream::~ofstream(local_1e98);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_21b0,"output-prefix",&local_21b1);
        boost::program_options::variables_map::operator[]((variables_map *)this_02,(string *)name);
        boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x2c3b96)
        ;
        std::operator+(in_stack_ffffffffffffd388,(char *)in_stack_ffffffffffffd380);
        std::ofstream::ofstream(local_2170,local_2190,_S_out);
        std::__cxx11::string::~string(local_2190);
        std::__cxx11::string::~string(local_21b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_21b1);
        pvVar12 = (void *)std::ostream::operator<<(local_2170,(double)local_1578);
        std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
        std::ofstream::~ofstream(local_2170);
      }
      poVar17 = std::operator<<((ostream *)&std::cout,"Step ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_1abc);
      poVar17 = std::operator<<(poVar17," of ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_20);
      poVar17 = std::operator<<(poVar17,": ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,(double)local_1c90);
      poVar17 = std::operator<<(poVar17," (best: ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,(double)local_1578);
      poVar17 = std::operator<<(poVar17,")");
      poVar17 = std::operator<<(poVar17,", ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_1c78);
      in_stack_ffffffffffffd430 = std::operator<<(poVar17," microseconds");
      std::ostream::operator<<(in_stack_ffffffffffffd430,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream(local_2330);
      in_stack_ffffffffffffd428 = (JointObservationSpace *)local_2351;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2351 + 1),"output-prefix",(allocator *)in_stack_ffffffffffffd428);
      in_stack_ffffffffffffd420 =
           (JointActionSpace *)
           boost::program_options::variables_map::operator[]
                     ((variables_map *)this_02,(string *)name);
      in_stack_ffffffffffffd418 =
           boost::program_options::variable_value::as<std::__cxx11::string>
                     ((variable_value *)0x2c3ecb);
      in_stack_ffffffffffffd410 =
           (RSSObservationModel *)
           std::operator<<((ostream *)local_2330,(string *)in_stack_ffffffffffffd418);
      poVar17 = std::operator<<((ostream *)in_stack_ffffffffffffd410,"/step");
      in_stack_ffffffffffffd404 = std::setw(3);
      local_2358 = in_stack_ffffffffffffd404._M_n;
      in_stack_ffffffffffffd3f8 = std::operator<<(poVar17,in_stack_ffffffffffffd404);
      in_stack_ffffffffffffd3f7 = std::setfill<char>('0');
      local_2359 = in_stack_ffffffffffffd3f7._M_c;
      in_stack_ffffffffffffd3e8 =
           (JointPolicy *)std::operator<<(in_stack_ffffffffffffd3f8,in_stack_ffffffffffffd3f7._M_c);
      in_stack_ffffffffffffd3e0 =
           (ostream *)std::ostream::operator<<(in_stack_ffffffffffffd3e8,local_1abc);
      std::operator<<(in_stack_ffffffffffffd3e0,"_");
      std::__cxx11::string::~string((string *)(local_2351 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2351);
      local_2368 = (basic_command_line_parser<char> *)0x0;
      while (pbVar22 = local_2368,
            in_stack_ffffffffffffd3d8 =
                 (basic_command_line_parser<char> *)
                 pgi::JointDiscreteSpace<pgi::DiscreteAction>::num_local_spaces
                           ((JointDiscreteSpace<pgi::DiscreteAction> *)0x2c4005),
            pbVar22 < in_stack_ffffffffffffd3d8) {
        std::__cxx11::ostringstream::str();
        std::operator+(__lhs,(char *)this_02);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffd398);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd390);
        std::operator+(__lhs,(char *)this_02);
        std::ofstream::ofstream(local_2568,local_2588,_S_out);
        std::__cxx11::string::~string(local_2588);
        std::__cxx11::string::~string(local_25a8);
        std::__cxx11::string::~string(local_2608);
        std::__cxx11::string::~string(local_25c8);
        std::__cxx11::string::~string(local_25e8);
        pgi::JointPolicy::local_policy(this_02,(size_t)name);
        in_stack_ffffffffffffd3c0 =
             (JointPolicy *)
             pgi::JointDiscreteSpace<pgi::DiscreteAction>::get
                       ((JointDiscreteSpace<pgi::DiscreteAction> *)this_02,(size_t)name);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                  ((DiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd398);
        in_stack_ffffffffffffd3b8 =
             pgi::JointDiscreteSpace<pgi::DiscreteObservation>::get
                       ((JointDiscreteSpace<pgi::DiscreteObservation> *)this_02,(size_t)name);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                  ((DiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd398);
        pgi::print(in_stack_ffffffffffffd3a0,in_stack_ffffffffffffd398,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd390,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd388);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)rng_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)rng_01);
        std::ofstream::~ofstream(local_2568);
        local_2368 = (basic_command_line_parser<char> *)&local_2368->field_0x1;
      }
      std::__cxx11::ostringstream::~ostringstream(local_2330);
      pgi::backpass::ImprovementResult::~ImprovementResult((ImprovementResult *)0x2c4385);
    }
    pgi::ParticleSet<pgi::GraphSensing::state_t>::ParticleSet
              ((ParticleSet<pgi::GraphSensing::state_t> *)in_stack_ffffffffffffd380,
               (ParticleSet<pgi::GraphSensing::state_t> *)pJVar20);
    in_stack_ffffffffffffd360 = local_d88;
    this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_f08 + 0x70);
    pgi::ForwardPassParticle<pgi::GraphSensing::state_t>::
    ForwardPassParticle<pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel>
              (this_00,pPVar16,jp_00,t_00,o_00,(JointActionSpace *)jas_00,jos_00,rng_02);
    pgi::ParticleSet<pgi::GraphSensing::state_t>::~ParticleSet
              ((ParticleSet<pgi::GraphSensing::state_t> *)in_stack_ffffffffffffd360);
    std::operator<<((ostream *)&std::cout,"Forward pass results: \n");
    local_26b4 = 1;
    while (uVar21 = local_26b4, uVar3 = pgi::JointPolicy::max_steps((JointPolicy *)0x2c4467),
          uVar21 <= uVar3) {
      pgi::JointPolicy::joint_vertices_with_steps_remaining
                (in_stack_ffffffffffffd3a8,(uint)((ulong)in_stack_ffffffffffffd3a0 >> 0x20));
      local_26c0 = local_26d8;
      local_26e0._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
      local_26e8 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_ffffffffffffd360,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)this_01), bVar2) {
        local_26f0 = __gnu_cxx::
                     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::operator*(&local_26e0);
        in_stack_ffffffffffffd3a8 =
             (JointPolicy *)
             pgi::JointPolicy::to_local(in_stack_ffffffffffffd360,(joint_vertex_t)this_01);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(uVar3,uVar21),
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffd3a8);
        local_2710 = local_2708;
        local_2718._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_ffffffffffffd360,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)this_01), bVar2) {
          puVar18 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2718);
          in_stack_ffffffffffffd3a0 = (ostream *)std::ostream::operator<<(&std::cout,*puVar18);
          std::operator<<(in_stack_ffffffffffffd3a0," ");
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_2718);
        }
        pPVar16 = pgi::ForwardPassParticle<pgi::GraphSensing::state_t>::particles_at
                            ((ForwardPassParticle<pgi::GraphSensing::state_t> *)
                             in_stack_ffffffffffffd360,(joint_vertex_t)this_01);
        poVar17 = std::operator<<((ostream *)&std::cout,": ");
        sVar19 = std::vector<double,_std::allocator<double>_>::size(&pPVar16->weights_);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,sVar19);
        std::operator<<(poVar17," particles\n");
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)rng_01);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_26e0);
      }
      local_3c0 = 0x14;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)rng_01);
      local_26b4 = local_26b4 + 1;
    }
    local_4 = 0;
    local_3c0 = 1;
    pgi::ForwardPassParticle<pgi::GraphSensing::state_t>::~ForwardPassParticle
              ((ForwardPassParticle<pgi::GraphSensing::state_t> *)0x2c476a);
    std::ofstream::~ofstream(local_1a58);
    std::ofstream::~ofstream(local_1528);
    std::ofstream::~ofstream(local_12e0);
    pgi::ParticleSet<pgi::GraphSensing::state_t>::~ParticleSet
              ((ParticleSet<pgi::GraphSensing::state_t> *)in_stack_ffffffffffffd360);
    pgi::JointPolicy::~JointPolicy(in_stack_ffffffffffffd360);
    std::
    vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ::~vector((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
               *)rng_01);
    pgi::GraphSensing::RSSObservationModel::~RSSObservationModel((RSSObservationModel *)0x2c47c5);
    pgi::JointDiscreteSpace<pgi::DiscreteObservation>::~JointDiscreteSpace
              ((JointDiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd360);
    pgi::GraphSensing::RewardModel::~RewardModel((RewardModel *)0x2c47df);
    pgi::GraphSensing::StateTransitionModel::~StateTransitionModel((StateTransitionModel *)0x2c47ec)
    ;
    pgi::JointDiscreteSpace<pgi::DiscreteAction>::~JointDiscreteSpace
              ((JointDiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd360);
  }
  else {
    pvVar12 = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_e0);
    std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_3c0 = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffd360);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffd360);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffd360);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  unsigned int rng_seed;
  unsigned int horizon;
  unsigned int width;
  int improvement_steps;
  int num_particles_fwd;
  int num_rollouts;
  int num_particle_rollout;
  std::size_t blind_policy_initial_joint_action;
  pgi::PolicyInitialization policy_initialization;

  double mx, my, sx, sy;  // optional gaussian initial belief params

  namespace po = boost::program_options;
  po::options_description config("NPGI planner for (Dec)POMDPs \nUsage: " +
                                 std::string(argv[0]) +
                                 " [OPTION]...\nOptions");
  config.add_options()("help", "produce help message")(
      "horizon,h", po::value<unsigned int>(&horizon)->default_value(3),
      "problem horizon")("policy-width,w",
                         po::value<unsigned int>(&width)->default_value(3),
                         "policy width")(
      "policy-initialization,p",
      po::value<pgi::PolicyInitialization>(&policy_initialization)
          ->default_value(pgi::PolicyInitialization::random),
      "policy initialization type: (random | greedy | blind)")(
      "blind-action,b",
      po::value<std::size_t>(&blind_policy_initial_joint_action)
          ->default_value(0),
      "action for blind policy initialization")(
      "improvement-steps,i",
      po::value<int>(&improvement_steps)->default_value(9),
      "number of policy improvement steps")(
      "num-rollouts,r",
      po::value<int>(&num_rollouts)->default_value(100),
      "number of rollouts for value estimation")
      (
      "num-particles-rollout,k", po::value<int>(&num_particle_rollout)->default_value(100),
      "number of particles per rollout")(
      "num-particles,n", po::value<int>(&num_particles_fwd)->default_value(1000),
      "number of particles in P(s,q) forward pass")(
      "seed,s", po::value<unsigned int>(&rng_seed)->default_value(1234567890),
      "random number seed")(
      "output-prefix,o", po::value<std::string>()->default_value("./"),
      "output prefix")("gaussian", po::bool_switch()->default_value(false),
                       "toggle for Gaussian initial belief")(
      "mx", po::value<double>(&mx)->default_value(0.1),
      "initial belief mean x value")("my",
                                     po::value<double>(&my)->default_value(0.1),
                                     "initial belief mean y value")(
      "sx", po::value<double>(&sx)->default_value(0.1),
      "initial belief x value standard deviation")(
      "sy", po::value<double>(&sy)->default_value(0.1),
      "initial belief y value standard deviation");

  po::options_description cmdline_options;
  cmdline_options.add(config);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv).options(cmdline_options).run(),
            vm);
  po::notify(vm);
  if (vm.count("help")) {
    std::cout << config << std::endl;
    return 1;
  }

  pgi::PRNG rng(rng_seed);

  // Create the GraphSensing Dec-POMDP problem
  pgi::JointActionSpace jas = pgi::GraphSensing::joint_action_space;
  pgi::GraphSensing::StateTransitionModel t;
  pgi::GraphSensing::RewardModel r;

  // RSS
  pgi::JointObservationSpace jos =
      pgi::GraphSensing::rss_joint_observation_space;
  pgi::GraphSensing::RSSObservationModel o;

  // Initialize policy
  std::vector<pgi::PolicyGraph> local_policy_graphs;
  for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
    local_policy_graphs.emplace_back(pgi::fixed_width(
        vm["horizon"].as<unsigned int>(), width, jas.num_local_indices(agent),
        jos.num_local_indices(agent)));
  }

  if (policy_initialization == pgi::PolicyInitialization::random) {
    pgi::set_random(local_policy_graphs, rng);
  } else if (policy_initialization == pgi::PolicyInitialization::greedy) {
    throw std::runtime_error(
        "Greedy open loop initialization not implemented for continuous-state "
        "problems!");
  } else if (policy_initialization == pgi::PolicyInitialization::blind) {
    pgi::set_random(local_policy_graphs,
                    rng);  // to randomize the edges in the policy
    pgi::set_blind(local_policy_graphs, blind_policy_initial_joint_action, jas);
  }
  pgi::JointPolicy jp(local_policy_graphs);

  // Create initial belief
  pgi::ParticleSet<pgi::GraphSensing::state_t> init_particles;
  if (vm["gaussian"].as<bool>()) {
    pgi::GraphSensing::sample_initial_states_gaussian(
        init_particles.states_, num_particles_fwd,
        pgi::GraphSensing::location_t{mx, my}, sx, sy, rng);
  } else {
    pgi::GraphSensing::sample_initial_states(init_particles.states_,
                                             num_particles_fwd, rng);
  }
  init_particles.nodes_ =
      std::vector<pgi::JointPolicy::joint_vertex_t>(num_particles_fwd, jp.root());
  init_particles.weights_ = std::vector<double>(
      num_particles_fwd, 1.0 / static_cast<double>(num_particles_fwd));

  // Set up output streams
  std::ofstream fvalue(vm["output-prefix"].as<std::string>() +
                       "policy_values.txt");
  std::ofstream ftime(vm["output-prefix"].as<std::string>() +
                      "duration_microseconds.txt");

  // Get value of initial policy
  double best_value = estimate_value(num_rollouts, init_particles.states_,
                                     init_particles.weights_, jp, jp.root(), t,
                                     o, r, jas, jos, rng);

  fvalue << best_value << std::endl;
  std::cout << "Policy value: " << best_value << std::endl;

  // write initial best policy and value
  for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
    std::ofstream fs(vm["output-prefix"].as<std::string>() +
                     "best_policy_agent" + std::to_string(agent) + ".dot");
    print(fs, jp.local_policy(agent), pgi::element_names(jas.get(agent)),
          pgi::element_names(jos.get(agent)));
  }

  std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
  fs << best_value << std::endl;

  // Backward pass setup
  pgi::backpass::BackPassProperties props;
  props.prob_random_history_in_heuristic_improvement = 0.05;

  for (int i = 1; i <= improvement_steps; ++i) {

    // sample new set of particles for improvement
    if (vm["gaussian"].as<bool>()) {
      pgi::GraphSensing::sample_initial_states_gaussian(
          init_particles.states_, num_particles_fwd,
          pgi::GraphSensing::location_t{mx, my}, sx, sy, rng);
    } else {
      pgi::GraphSensing::sample_initial_states(init_particles.states_,
                                               num_particles_fwd, rng);
    }
    init_particles.nodes_ =
        std::vector<pgi::JointPolicy::joint_vertex_t>(num_particles_fwd, jp.root());
    init_particles.weights_ = std::vector<double>(
        num_particles_fwd, 1.0 / static_cast<double>(num_particles_fwd));

    std::chrono::high_resolution_clock::time_point t1 =
        std::chrono::high_resolution_clock::now();
    auto bp = pgi::backpass::improve_particle(num_rollouts, num_particle_rollout, init_particles, jp, t, o, r, jas,
                                              jos, rng, props);
    std::chrono::high_resolution_clock::time_point t3 =
        std::chrono::high_resolution_clock::now();
    auto duration =
        std::chrono::duration_cast<std::chrono::microseconds>(t3 - t1).count();
    ftime << duration << std::endl;

    // check
    double improved_policy_value = estimate_value(
        num_rollouts, init_particles.states_, init_particles.weights_, bp.improved_policy,
        bp.improved_policy.root(), t, o, r, jas, jos, rng);

    fvalue << improved_policy_value << std::endl;

    if (improved_policy_value > best_value) {
      best_value = improved_policy_value;
      jp = bp.improved_policy;

      // Update best value and policy!
      for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
        std::ofstream fs(vm["output-prefix"].as<std::string>() +
                         "best_policy_agent" + std::to_string(agent) + ".dot");
        print(fs, jp.local_policy(agent), pgi::element_names(jas.get(agent)),
              pgi::element_names(jos.get(agent)));
      }

      std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
      fs << best_value << std::endl;
    }

    std::cout << "Step " << i << " of " << improvement_steps << ": "
              << improved_policy_value << " (best: " << best_value << ")"
              << ", " << duration << " microseconds" << std::endl;

    std::ostringstream ss;
    ss << vm["output-prefix"].as<std::string>() << "/step" << std::setw(3)
       << std::setfill('0') << i << "_";

    for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
      std::ofstream fs(ss.str() + "agent" + std::to_string(agent) + ".dot");
      print(fs, bp.improved_policy.local_policy(agent),
            pgi::element_names(jas.get(agent)),
            pgi::element_names(jos.get(agent)));
    }
  }

  pgi::ForwardPassParticle<pgi::GraphSensing::state_t> fwd(init_particles, jp,
                                                           t, o, jas, jos, rng);
  std::cout << "Forward pass results: \n";
  for (unsigned int s = 1; s <= jp.max_steps(); ++s) {
  for (auto& q : jp.joint_vertices_with_steps_remaining(s))
  {
    auto ql = jp.to_local(q);
    for (auto& qq : ql)
      std::cout << qq << " ";

    const pgi::ParticleSet<pgi::GraphSensing::state_t>& p = fwd.particles_at(q);
    std::cout << ": " << p.weights_.size() << " particles\n";

  }
  }

  return 0;
}